

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pockle.c
# Opt level: O3

strbuf * pockle_mpu(Pockle *pockle,mp_int *p)

{
  ulong uVar1;
  PocklePrimeRecord *pPVar2;
  long lVar3;
  strbuf *sb;
  void *pvVar4;
  void *__s;
  size_t sVar5;
  char *fmt;
  BinarySink *bs;
  ulong uVar6;
  ulong uVar7;
  
  sb = strbuf_new_nm();
  pvVar4 = find234(pockle->tree,p,ppr_find);
  if (pvVar4 == (void *)0x0) {
    __assert_fail("pr",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/pockle.c"
                  ,0x197,"strbuf *pockle_mpu(Pockle *, mp_int *)");
  }
  __s = safemalloc(pockle->nlist,1,0);
  memset(__s,0,pockle->nlist);
  *(undefined1 *)((long)__s + *(long *)((long)pvVar4 + 0x20)) = 1;
  bs = sb->binarysink_;
  BinarySink_put_fmt(bs,"[MPU - Primality Certificate]\nVersion 1.0\nBase 10\n\nProof for:\nN  ");
  mp_write_decimal(sb,p);
  BinarySink_put_fmt(bs,"\n");
  uVar1 = pockle->nlist;
  do {
    do {
      if (uVar1 == 0) {
        safefree(__s);
        return sb;
      }
      lVar3 = uVar1 - 1;
      uVar1 = uVar1 - 1;
    } while (*(char *)((long)__s + lVar3) != '\x01');
    pPVar2 = pockle->list[uVar1];
    sVar5 = mp_get_nbits(pPVar2->prime);
    if (sVar5 < 0x41) {
      BinarySink_put_fmt(bs,"\nType Small\nN  ");
      mp_write_decimal(sb,pPVar2->prime);
      fmt = "\n";
    }
    else {
      if (pPVar2->witness == (mp_int *)0x0) {
        __assert_fail("pr->witness",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/pockle.c"
                      ,0x1ac,"strbuf *pockle_mpu(Pockle *, mp_int *)");
      }
      BinarySink_put_fmt(bs,"\nType BLS5\nN  ");
      mp_write_decimal(sb,pPVar2->prime);
      BinarySink_put_fmt(bs,"\n");
      if (pPVar2->nfactors != 0) {
        uVar7 = 0;
        do {
          uVar6 = uVar7 + 1;
          BinarySink_put_fmt(bs,"Q[%zu]  ",uVar6);
          mp_write_decimal(sb,pPVar2->factors[uVar7]->prime);
          uVar7 = pPVar2->factors[uVar7]->index;
          if (uVar1 <= uVar7) {
            __assert_fail("pr->factors[i]->index < index",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/pockle.c"
                          ,0x1b3,"strbuf *pockle_mpu(Pockle *, mp_int *)");
          }
          *(undefined1 *)((long)__s + uVar7) = 1;
          BinarySink_put_fmt(bs,"\n");
          uVar7 = uVar6;
        } while (uVar6 < pPVar2->nfactors);
        fmt = "----\n";
        if (pPVar2->nfactors == 0xffffffffffffffff) goto LAB_00118b77;
      }
      uVar7 = 0;
      do {
        BinarySink_put_fmt(bs,"A[%zu]  ",uVar7);
        mp_write_decimal(sb,pPVar2->witness);
        BinarySink_put_fmt(bs,"\n");
        uVar7 = uVar7 + 1;
      } while (uVar7 < pPVar2->nfactors + 1);
      fmt = "----\n";
    }
LAB_00118b77:
    BinarySink_put_fmt(bs,fmt);
  } while( true );
}

Assistant:

strbuf *pockle_mpu(Pockle *pockle, mp_int *p)
{
    strbuf *sb = strbuf_new_nm();
    PocklePrimeRecord *pr = find234(pockle->tree, p, ppr_find);
    assert(pr);

    bool *needed = snewn(pockle->nlist, bool);
    memset(needed, 0, pockle->nlist * sizeof(bool));
    needed[pr->index] = true;

    put_fmt(sb, "[MPU - Primality Certificate]\nVersion 1.0\nBase 10\n\n"
            "Proof for:\nN  ");
    mp_write_decimal(sb, p);
    put_fmt(sb, "\n");

    for (size_t index = pockle->nlist; index-- > 0 ;) {
        if (!needed[index])
            continue;
        pr = pockle->list[index];

        if (mp_get_nbits(pr->prime) <= 64) {
            put_fmt(sb, "\nType Small\nN  ");
            mp_write_decimal(sb, pr->prime);
            put_fmt(sb, "\n");
        } else {
            assert(pr->witness);
            put_fmt(sb, "\nType BLS5\nN  ");
            mp_write_decimal(sb, pr->prime);
            put_fmt(sb, "\n");
            for (size_t i = 0; i < pr->nfactors; i++) {
                put_fmt(sb, "Q[%"SIZEu"]  ", i+1);
                mp_write_decimal(sb, pr->factors[i]->prime);
                assert(pr->factors[i]->index < index);
                needed[pr->factors[i]->index] = true;
                put_fmt(sb, "\n");
            }
            for (size_t i = 0; i < pr->nfactors + 1; i++) {
                put_fmt(sb, "A[%"SIZEu"]  ", i);
                mp_write_decimal(sb, pr->witness);
                put_fmt(sb, "\n");
            }
            put_fmt(sb, "----\n");
        }
    }
    sfree(needed);

    return sb;
}